

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPile.cpp
# Opt level: O0

void __thiscall solitaire::piles::TableauPile::Snapshot::restore(Snapshot *this)

{
  uint uVar1;
  element_type *peVar2;
  Snapshot *this_local;
  
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->tableauPile);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::operator=
            (&peVar2->cards,&this->pileCards);
  uVar1 = this->topCoveredCardPosition;
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->tableauPile);
  peVar2->topCoveredCardPosition = uVar1;
  return;
}

Assistant:

void TableauPile::Snapshot::restore() const {
    tableauPile->cards = pileCards;
    tableauPile->topCoveredCardPosition = topCoveredCardPosition;
}